

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.hpp
# Opt level: O1

Publication * __thiscall
helics::ValueFederate::registerPublication<std::__cxx11::string>
          (ValueFederate *this,string_view name,string_view units)

{
  Publication *pPVar1;
  string_view type;
  char local_20 [16];
  
  builtin_strncpy(local_20,"string",7);
  type._M_str = local_20;
  type._M_len = 6;
  pPVar1 = registerPublication(this,name,type,units);
  return pPVar1;
}

Assistant:

Input& registerInput(std::string_view name, std::string_view units = std::string_view{})
    {
        return registerInput(name, ValueConverter<X>::type(), units);
    }